

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_strex(DisasContext_conflict1 *s,arg_STREX *a,MemOp mop,_Bool rel)

{
  int iVar1;
  int iVar2;
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar3;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  MemOp MVar4;
  TCGTemp *pTVar5;
  TCGLabel *l;
  TCGLabel *a1;
  TCGv_i64 ret;
  TCGTemp *pTVar6;
  MemOp MVar7;
  TCGv_i32 high;
  uint uVar8;
  TCGv_i32 low;
  TCGv_i64 ret_00;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i32 var;
  uintptr_t o_1;
  TCGv_i32 var_00;
  TCGv_i32 var_01;
  TCGv_i64 dest;
  uintptr_t o_5;
  TCGv_i32 retv;
  
  iVar1 = a->rd;
  if ((((iVar1 != 0xf) && (a->rn != 0xf)) && (iVar2 = a->rt, iVar1 != iVar2)) &&
     ((iVar1 != a->rn && (iVar2 != 0xf)))) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar8 = (uint)s->features & 0x8000200;
    if (((uVar8 == 0x8000000) || ((s->thumb == 0 || (iVar2 != 0xd && iVar1 != 0xd)))) &&
       ((mop != MO_64 ||
        ((iVar2 = a->rt2, iVar1 != iVar2 && iVar2 != 0xf &&
         (((uVar8 == 0x8000000 || (iVar2 != 0xd)) || (s->thumb == 0)))))))) {
      if (rel) {
        tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_STRL|TCG_MO_ALL);
      }
      pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,true);
      var_00 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
      load_reg_var(s,var_00,a->rn);
      tcg_gen_addi_i32_aarch64(tcg_ctx,var_00,var_00,a->imm);
      iVar1 = a->rd;
      iVar2 = a->rt;
      reg = a->rt2;
      s_00 = s->uc->tcg_ctx;
      MVar4 = s->be_data | mop;
      l = gen_new_label_aarch64(s_00);
      a1 = gen_new_label_aarch64(s_00);
      pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_extu_i32_i64_aarch64(s_00,(TCGv_i64)((long)pTVar5 - (long)s_00),var_00);
      tcg_gen_brcond_i64_aarch64
                (s_00,TCG_COND_NE,(TCGv_i64)((long)pTVar5 - (long)s_00),s_00->cpu_exclusive_addr,l);
      tcg_temp_free_internal_aarch64(s_00,pTVar5);
      pTVar3 = s->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar5 - (long)pTVar3);
      tcg_gen_extu_i32_i64_aarch64(pTVar3,ret,var_00);
      if ((((s->uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) && (s->sctlr_b != 0)) &&
         (MVar7 = MVar4 & MO_64, MVar7 < MO_32)) {
        tcg_gen_xori_i64_aarch64(pTVar3,ret,ret,(ulong)((-1 << (sbyte)MVar7) + 4));
      }
      MVar4 = MVar4 | MO_ALIGN;
      pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      retv = (TCGv_i32)((long)pTVar5 - (long)s_00);
      pTVar3 = s->uc->tcg_ctx;
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      var_01 = (TCGv_i32)((long)pTVar6 - (long)pTVar3);
      load_reg_var(s,var_01,iVar2);
      if (mop == MO_64) {
        pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        ret_00 = (TCGv_i64)((long)pTVar6 - (long)s_00);
        pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        dest = (TCGv_i64)((long)pTVar6 - (long)s_00);
        pTVar3 = s->uc->tcg_ctx;
        pTVar6 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
        var = (TCGv_i32)((long)pTVar6 - (long)pTVar3);
        load_reg_var(s,var,reg);
        high = var;
        low = var_01;
        if (s->be_data == MO_BE) {
          high = var_01;
          low = var;
        }
        tcg_gen_concat_i32_i64_aarch64(s_00,dest,low,high);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
        tcg_gen_atomic_cmpxchg_i64_aarch64
                  (s_00,ret_00,ret,s_00->cpu_exclusive_val,dest,(ulong)(s->mmu_idx & 0xf),MVar4);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(dest + (long)s_00));
        tcg_gen_setcond_i64_aarch64(s_00,TCG_COND_NE,ret_00,ret_00,s_00->cpu_exclusive_val);
        tcg_gen_extrl_i64_i32_aarch64(s_00,retv,ret_00);
      }
      else {
        pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        ret_00 = (TCGv_i64)((long)pTVar6 - (long)s_00);
        tcg_gen_extrl_i64_i32_aarch64(s_00,(TCGv_i32)ret_00,s_00->cpu_exclusive_val);
        tcg_gen_atomic_cmpxchg_i32_aarch64
                  (s_00,retv,ret,(TCGv_i32)ret_00,var_01,(ulong)(s->mmu_idx & 0xf),MVar4);
        tcg_gen_setcond_i32_aarch64(s_00,TCG_COND_NE,retv,retv,(TCGv_i32)ret_00);
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_01 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
      if (s_00->cpu_R[iVar1] != retv) {
        tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_R[iVar1] + (long)s_00),
                            (TCGArg)pTVar5);
      }
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(retv + (long)s_00));
      *(short *)&a1->field_0x2 =
           (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
      tcg_gen_op1_aarch64(s_00,INDEX_op_br,(TCGArg)a1);
      *(byte *)l = *(byte *)l | 1;
      tcg_gen_op1_aarch64(s_00,INDEX_op_set_label,(TCGArg)l);
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,
                          (TCGArg)((long)&s_00->pool_cur + (long)s_00->cpu_R[iVar1]),1);
      *(byte *)a1 = *(byte *)a1 | 1;
      tcg_gen_op1_aarch64(s_00,INDEX_op_set_label,(TCGArg)a1);
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)(s_00->cpu_exclusive_addr + (long)s_00),
                          0xffffffffffffffff);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
      return (_Bool)extraout_AL_00;
    }
  }
  unallocated_encoding_aarch64(s);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_strex(DisasContext *s, arg_STREX *a, MemOp mop, bool rel)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr;
    /* Some cases stopped being UNPREDICTABLE in v8A (but not v8M) */
    bool v8a = ENABLE_ARCH_8 && !arm_dc_feature(s, ARM_FEATURE_M);

    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rd == 15 || a->rn == 15 || a->rt == 15
        || a->rd == a->rn || a->rd == a->rt
        || (!v8a && s->thumb && (a->rd == 13 || a->rt == 13))
        || (mop == MO_64
            && (a->rt2 == 15
                || a->rd == a->rt2
                || (!v8a && s->thumb && a->rt2 == 13)))) {
        unallocated_encoding(s);
        return true;
    }

    if (rel) {
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    }

    addr = tcg_temp_local_new_i32(tcg_ctx);
    load_reg_var(s, addr, a->rn);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, a->imm);

    gen_store_exclusive(s, a->rd, a->rt, a->rt2, addr, mop);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}